

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O3

optional<uint256> * __thiscall
BlockFilterIndex::ReadFilterHeader
          (optional<uint256> *__return_storage_ptr__,BlockFilterIndex *this,int height,
          uint256 *expected_block_hash)

{
  string_view source_file;
  bool bVar1;
  Logger *pLVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  string_view str;
  string_view logging_function;
  pair<uint256,_(anonymous_namespace)::DBVal> read_out;
  string log_msg;
  string local_178;
  string local_158;
  undefined1 local_138 [17];
  uchar uStack_127;
  uchar uStack_126;
  uchar uStack_125;
  uchar uStack_124;
  uchar uStack_123;
  uchar uStack_122;
  uchar uStack_121;
  uchar uStack_120;
  uchar uStack_11f;
  uchar uStack_11e;
  uchar uStack_11d;
  uchar uStack_11c;
  uchar uStack_11b;
  uchar uStack_11a;
  uchar uStack_119;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  FlatFilePos local_d8;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  stack0xfffffffffffffed8 = (undefined1  [16])0x0;
  local_138._0_16_ = (undefined1  [16])0x0;
  local_d8.nFile = -1;
  local_d8.nPos = 0;
  local_50._M_dataplus._M_p._0_4_ = height;
  bVar1 = CDBWrapper::
          Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                    (&((this->m_db)._M_t.
                       super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                       super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper
                     ,(DBHeightKey *)&local_50,
                     (pair<uint256,_(anonymous_namespace)::DBVal> *)local_138);
  if (bVar1) {
    auVar4[0] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x10] ==
                 local_138[0x10]);
    auVar4[1] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x11] == uStack_127);
    auVar4[2] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x12] == uStack_126);
    auVar4[3] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x13] == uStack_125);
    auVar4[4] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x14] == uStack_124);
    auVar4[5] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x15] == uStack_123);
    auVar4[6] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x16] == uStack_122);
    auVar4[7] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x17] == uStack_121);
    auVar4[8] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x18] == uStack_120);
    auVar4[9] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x19] == uStack_11f);
    auVar4[10] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1a] == uStack_11e)
    ;
    auVar4[0xb] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1b] == uStack_11d
                   );
    auVar4[0xc] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1c] == uStack_11c
                   );
    auVar4[0xd] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1d] == uStack_11b
                   );
    auVar4[0xe] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1e] == uStack_11a
                   );
    auVar4[0xf] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1f] == uStack_119
                   );
    auVar3[0] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0] == local_138[0]);
    auVar3[1] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[1] == local_138[1]);
    auVar3[2] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[2] == local_138[2]);
    auVar3[3] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[3] == local_138[3]);
    auVar3[4] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[4] == local_138[4]);
    auVar3[5] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[5] == local_138[5]);
    auVar3[6] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[6] == local_138[6]);
    auVar3[7] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[7] == local_138[7]);
    auVar3[8] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[8] == local_138[8]);
    auVar3[9] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[9] == local_138[9]);
    auVar3[10] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[10] == local_138[10]
                  );
    auVar3[0xb] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0xb] ==
                   local_138[0xb]);
    auVar3[0xc] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0xc] ==
                   local_138[0xc]);
    auVar3[0xd] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0xd] ==
                   local_138[0xd]);
    auVar3[0xe] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0xe] ==
                   local_138[0xe]);
    auVar3[0xf] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0xf] ==
                   local_138[0xf]);
    auVar3 = auVar3 & auVar4;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x10) = local_e8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x18) = local_e8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
        super__Optional_payload_base<uint256>._M_payload = local_f8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 8) = local_f8._8_8_;
      bVar1 = true;
      goto LAB_00883cf7;
    }
    base_blob<256u>::ToString_abi_cxx11_(&local_158,local_138);
    base_blob<256u>::ToString_abi_cxx11_(&local_178,expected_block_hash);
    pLVar2 = LogInstance();
    bVar1 = BCLog::Logger::Enabled(pLVar2);
    if (bVar1) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      tinyformat::format<char[17],std::__cxx11::string,std::__cxx11::string>
                (&local_70,
                 (tinyformat *)
                 "%s: previous block header belongs to unexpected block %s; expected %s\n",
                 "ReadFilterHeader",(char (*) [17])&local_158,&local_178,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pLVar2 = LogInstance();
      local_70._M_dataplus._M_p = (pointer)0x63;
      local_70._M_string_length = 0xf98ee8;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
      ;
      source_file._M_len = 99;
      str._M_str = local_50._M_dataplus._M_p;
      str._M_len = local_50._M_string_length;
      logging_function._M_str = "ReadFilterHeader";
      logging_function._M_len = 0x10;
      BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0xf4,ALL,Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = false;
LAB_00883cf7:
  (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = bVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint256> BlockFilterIndex::ReadFilterHeader(int height, const uint256& expected_block_hash)
{
    std::pair<uint256, DBVal> read_out;
    if (!m_db->Read(DBHeightKey(height), read_out)) {
        return std::nullopt;
    }

    if (read_out.first != expected_block_hash) {
        LogError("%s: previous block header belongs to unexpected block %s; expected %s\n",
                         __func__, read_out.first.ToString(), expected_block_hash.ToString());
        return std::nullopt;
    }

    return read_out.second.header;
}